

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O2

void __thiscall NPC::Spawn(NPC *this,NPC *parent)

{
  short sVar1;
  pointer ppNVar2;
  NPC *this_00;
  Character *this_01;
  uchar y;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ENF_Data *pEVar6;
  byte bVar7;
  pointer ppNVar8;
  list<Character_*,_std::allocator<Character_*>_> *plVar9;
  _List_node_base *p_Var10;
  uint uVar11;
  double dVar12;
  PacketBuilder builder;
  
  if (this->alive == false) {
    pEVar6 = ENF(this);
    if ((parent == (NPC *)0x0) && (pEVar6->boss != 0)) {
      ppNVar2 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppNVar8 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppNVar8 != ppNVar2; ppNVar8 = ppNVar8 + 1) {
        this_00 = *ppNVar8;
        pEVar6 = ENF(this_00);
        if (pEVar6->child != 0) {
          Spawn(this_00,this);
        }
      }
    }
    if (parent != (NPC *)0x0) {
      this->parent = parent;
    }
    if (this->spawn_type < 7) {
      uVar11 = 0;
      while( true ) {
        bVar7 = this->spawn_x;
        if (uVar11 == 200) break;
        if ((uVar11 == 0) && (this->temporary != false)) {
          this->x = bVar7;
          y = this->spawn_y;
          this->y = y;
        }
        else {
          iVar5 = util::rand();
          this->x = (uchar)iVar5;
          iVar5 = util::rand();
          y = (uchar)iVar5;
          this->y = y;
          bVar7 = this->x;
        }
        bVar3 = Map::Walkable(this->map,bVar7,y,true);
        if (bVar3) {
          if (uVar11 < 0x65) {
            bVar3 = Map::Occupied(this->map,this->x,this->y,NPCOnly,false);
            if (bVar3) goto LAB_001799cd;
          }
          iVar5 = util::rand();
          this->direction = (Direction)iVar5;
          goto LAB_00179a8d;
        }
LAB_001799cd:
        uVar11 = uVar11 + 1;
      }
      sVar1 = this->map->id;
      bVar4 = this->spawn_y;
      pEVar6 = ::ENF::Get(this->map->world->enf,this->id);
      Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)",
                   (ulong)(uint)(int)sVar1,(ulong)bVar7,(ulong)bVar4,(pEVar6->name)._M_dataplus._M_p
                  );
      bVar4 = this->spawn_x;
      bVar7 = bVar4 - 2;
      while( true ) {
        this->x = bVar7;
        if (bVar4 + 2 < (uint)bVar7) break;
        bVar4 = this->spawn_y;
        bVar7 = bVar4 - 2;
        while( true ) {
          this->y = bVar7;
          if (bVar4 + 2 < (uint)bVar7) break;
          bVar3 = Map::Walkable(this->map,this->x,bVar7,true);
          if (bVar3) {
            Console::Wrn("Placed at valid location: %i,%i",(ulong)this->x,(ulong)this->y);
            goto LAB_00179a8d;
          }
          bVar4 = this->spawn_y;
          bVar7 = this->y + 1;
        }
        bVar4 = this->spawn_x;
        bVar7 = this->x + 1;
      }
      Console::Err("NPC couldn\'t spawn anywhere valid!");
    }
LAB_00179a8d:
    this->alive = true;
    pEVar6 = ENF(this);
    this->hp = pEVar6->hp;
    dVar12 = Timer::GetTime();
    this->last_act = dVar12;
    this->act_speed = speed_table[this->spawn_type];
    PacketBuilder::PacketBuilder(&builder,PACKET_APPEAR,PACKET_REPLY,8);
    PacketBuilder::AddChar(&builder,'\0');
    PacketBuilder::AddByte(&builder,0xff);
    PacketBuilder::AddChar(&builder,this->index);
    PacketBuilder::AddShort(&builder,(unsigned_short)this->id);
    PacketBuilder::AddChar(&builder,this->x);
    PacketBuilder::AddChar(&builder,this->y);
    PacketBuilder::AddChar(&builder,this->direction);
    plVar9 = &this->map->characters;
    p_Var10 = (_List_node_base *)plVar9;
    while (p_Var10 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var10->_M_next)->
                     _M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)plVar9) {
      this_01 = (Character *)p_Var10[1]._M_next;
      bVar3 = Character::InRange(this_01,this);
      if (bVar3) {
        Character::Send(this_01,&builder);
      }
    }
    PacketBuilder::~PacketBuilder(&builder);
  }
  return;
}

Assistant:

void NPC::Spawn(NPC *parent)
{
	if (this->alive)
		return;

	if (this->ENF().boss && !parent)
	{
		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().child)
			{
				npc->Spawn(this);
			}
		}
	}

	if (parent)
	{
		this->parent = parent;
	}

	if (this->spawn_type < 7)
	{
		bool found = false;
		for (int i = 0; i < 200; ++i)
		{
			if (this->temporary && i == 0)
			{
				this->x = this->spawn_x;
				this->y = this->spawn_y;
			}
			else
			{
				this->x = util::rand(this->spawn_x-2, this->spawn_x+2);
				this->y = util::rand(this->spawn_y-2, this->spawn_y+2);
			}

			if (this->map->Walkable(this->x, this->y, true) && (i > 100 || !this->map->Occupied(this->x, this->y, Map::NPCOnly)))
			{
				this->direction = static_cast<Direction>(util::rand(0,3));
				found = true;
				break;
			}
		}

		if (!found)
		{
			Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)", this->map->id, this->spawn_x, this->spawn_y, this->map->world->enf->Get(this->id).name.c_str());
			for (this->x = this->spawn_x-2; this->x <= spawn_x+2; ++this->x)
			{
				for (this->y = this->spawn_y-2; this->y <= this->spawn_y+2; ++this->y)
				{
					if (this->map->Walkable(this->x, this->y, true))
					{
						Console::Wrn("Placed at valid location: %i,%i", this->x, this->y);
						found = true;
						goto end_linear_scan;
					}
				}
			}
		}
		end_linear_scan:

		if (!found)
		{
			Console::Err("NPC couldn't spawn anywhere valid!");
		}
	}

	this->alive = true;
	this->hp = this->ENF().hp;
	this->last_act = Timer::GetTime();
	this->act_speed = speed_table[this->spawn_type];

	PacketBuilder builder(PACKET_APPEAR, PACKET_REPLY, 8);
	builder.AddChar(0);
	builder.AddByte(255);
	builder.AddChar(this->index);
	builder.AddShort(this->id);
	builder.AddChar(this->x);
	builder.AddChar(this->y);
	builder.AddChar(this->direction);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (character->InRange(this))
		{
			character->Send(builder);
		}
	}
}